

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void anon_unknown.dwarf_4171f6c::SeedSlow(CSHA512 *hasher,RNGState *rng)

{
  long lVar1;
  long in_FS_OFFSET;
  uchar buffer [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SeedFast(hasher);
  GetOSRand(buffer);
  CSHA512::Write(hasher,buffer,0x20);
  RNGState::SeedEvents(rng,hasher);
  SeedTimestamp(hasher);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedSlow(CSHA512& hasher, RNGState& rng) noexcept
{
    unsigned char buffer[32];

    // Everything that the 'fast' seeder includes
    SeedFast(hasher);

    // OS randomness
    GetOSRand(buffer);
    hasher.Write(buffer, sizeof(buffer));

    // Add the events hasher into the mix
    rng.SeedEvents(hasher);

    // High-precision timestamp.
    //
    // Note that we also commit to a timestamp in the Fast seeder, so we indirectly commit to a
    // benchmark of all the entropy gathering sources in this function).
    SeedTimestamp(hasher);
}